

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

int ON_DimStyle::V5ArrowType(arrow_type v6type)

{
  int iVar1;
  
  iVar1 = 0;
  if (v6type - Dot < 7) {
    iVar1 = v6type - SolidTriangle;
  }
  return iVar1;
}

Assistant:

int ON_DimStyle::V5ArrowType(ON_Arrowhead::arrow_type v6type)
{
  int v5type;
  switch (v6type)
  {
  default:
  case ON_Arrowhead::arrow_type::SolidTriangle:
  case ON_Arrowhead::arrow_type::UserBlock:
    v5type = ON_V5x_DimStyle::eArrowType::solidtriangle;
    break;
  case ON_Arrowhead::arrow_type::Dot:
    v5type = ON_V5x_DimStyle::eArrowType::dot;
    break;
  case ON_Arrowhead::arrow_type::Tick:
    v5type = ON_V5x_DimStyle::eArrowType::tick;
    break;
  case ON_Arrowhead::arrow_type::ShortTriangle:
    v5type = ON_V5x_DimStyle::eArrowType::shorttriangle;
    break;
  case ON_Arrowhead::arrow_type::OpenArrow:
    v5type = ON_V5x_DimStyle::eArrowType::arrow;
    break;
  case ON_Arrowhead::arrow_type::Rectangle:
    v5type = ON_V5x_DimStyle::eArrowType::rectangle;
    break;
  case ON_Arrowhead::arrow_type::LongTriangle:
    v5type = ON_V5x_DimStyle::eArrowType::longtriangle;
    break;
  case ON_Arrowhead::arrow_type::LongerTriangle:
    v5type = ON_V5x_DimStyle::eArrowType::longertriangle;
    break;
  }

  return v5type;
}